

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_5x52_impl.h
# Opt level: O0

int secp256k1_fe_impl_normalizes_to_zero(secp256k1_fe *r)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  long *in_RDI;
  uint64_t x;
  uint64_t z1;
  uint64_t z0;
  uint64_t t4;
  uint64_t t3;
  uint64_t t2;
  uint64_t t1;
  uint64_t t0;
  
  uVar1 = ((ulong)in_RDI[4] >> 0x30) * 0x1000003d1 + *in_RDI;
  uVar2 = (uVar1 >> 0x34) + in_RDI[1];
  uVar1 = uVar1 & 0xfffffffffffff;
  uVar3 = (uVar2 >> 0x34) + in_RDI[2];
  uVar2 = uVar2 & 0xfffffffffffff;
  uVar4 = (uVar3 >> 0x34) + in_RDI[3];
  uVar3 = uVar3 & 0xfffffffffffff;
  uVar5 = (uVar4 >> 0x34) + (in_RDI[4] & 0xffffffffffffU);
  uVar4 = uVar4 & 0xfffffffffffff;
  return (uint)(uVar5 == 0 && (uVar4 == 0 && (uVar3 == 0 && (uVar2 == 0 && uVar1 == 0))) ||
               ((uVar5 ^ 0xf000000000000) & uVar4 & uVar3 & uVar2 & (uVar1 ^ 0x1000003d0)) ==
               0xfffffffffffff);
}

Assistant:

static int secp256k1_fe_impl_normalizes_to_zero(const secp256k1_fe *r) {
    uint64_t t0 = r->n[0], t1 = r->n[1], t2 = r->n[2], t3 = r->n[3], t4 = r->n[4];

    /* z0 tracks a possible raw value of 0, z1 tracks a possible raw value of P */
    uint64_t z0, z1;

    /* Reduce t4 at the start so there will be at most a single carry from the first pass */
    uint64_t x = t4 >> 48; t4 &= 0x0FFFFFFFFFFFFULL;

    /* The first pass ensures the magnitude is 1, ... */
    t0 += x * 0x1000003D1ULL;
    t1 += (t0 >> 52); t0 &= 0xFFFFFFFFFFFFFULL; z0  = t0; z1  = t0 ^ 0x1000003D0ULL;
    t2 += (t1 >> 52); t1 &= 0xFFFFFFFFFFFFFULL; z0 |= t1; z1 &= t1;
    t3 += (t2 >> 52); t2 &= 0xFFFFFFFFFFFFFULL; z0 |= t2; z1 &= t2;
    t4 += (t3 >> 52); t3 &= 0xFFFFFFFFFFFFFULL; z0 |= t3; z1 &= t3;
                                                z0 |= t4; z1 &= t4 ^ 0xF000000000000ULL;

    /* ... except for a possible carry at bit 48 of t4 (i.e. bit 256 of the field element) */
    VERIFY_CHECK(t4 >> 49 == 0);

    return (z0 == 0) | (z1 == 0xFFFFFFFFFFFFFULL);
}